

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestReferenceCounting::initTextures(TextureViewTestReferenceCounting *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  size_type sVar7;
  reference pvVar8;
  byte bVar9;
  uchar *texel_data_ptr;
  uint n_texel;
  uint mipmap_width;
  uint mipmap_height;
  _norm_vec4 *mipmap_color;
  void *pvStack_20;
  uint n_mipmap;
  uchar *texel_data;
  Functions *gl;
  TextureViewTestReferenceCounting *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar6 + 0x6f8))(1,&this->m_parent_to_id);
  (**(code **)(lVar6 + 0x6f8))(1,&this->m_view_to_id);
  (**(code **)(lVar6 + 0x6f8))(1,&this->m_view_view_to_id);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glGenTextures() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2723);
  (**(code **)(lVar6 + 0xb8))(0xde1,this->m_parent_to_id);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glBindTexture() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2727);
  (**(code **)(lVar6 + 0x1380))
            (0xde1,this->m_texture_n_levels,0x8058,this->m_texture_width,this->m_texture_height);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glTexStorage2D() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x272a);
  (**(code **)(lVar6 + 0x14b0))
            (this->m_view_to_id,0xde1,this->m_parent_to_id,0x8058,0,this->m_texture_n_levels,0,1);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glTextureView() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2730);
  (**(code **)(lVar6 + 0x14b0))
            (this->m_view_view_to_id,0xde1,this->m_view_to_id,0x8058,0,this->m_texture_n_levels,0,1)
  ;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glTextureView() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2736);
  pvStack_20 = operator_new__((ulong)(this->m_texture_width * this->m_texture_height * 4));
  mipmap_color._4_4_ = 0;
  while( true ) {
    sVar7 = std::
            vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
            ::size(&this->m_mipmap_colors);
    if (sVar7 <= mipmap_color._4_4_) break;
    pvVar8 = std::
             vector<gl4cts::TextureViewTestReferenceCounting::_norm_vec4,_std::allocator<gl4cts::TextureViewTestReferenceCounting::_norm_vec4>_>
             ::operator[](&this->m_mipmap_colors,(ulong)mipmap_color._4_4_);
    uVar1 = this->m_texture_height;
    bVar9 = (byte)mipmap_color._4_4_;
    uVar2 = this->m_texture_width;
    for (texel_data_ptr._4_4_ = 0;
        texel_data_ptr._4_4_ < (uVar1 >> (bVar9 & 0x1f)) * (uVar2 >> (bVar9 & 0x1f));
        texel_data_ptr._4_4_ = texel_data_ptr._4_4_ + 1) {
      *(undefined4 *)((long)pvStack_20 + (ulong)texel_data_ptr._4_4_ * 4) =
           *(undefined4 *)pvVar8->rgba;
    }
    (**(code **)(lVar6 + 0x13b8))
              (0xde1,mipmap_color._4_4_,0,0,this->m_texture_width >> (bVar9 & 0x1f),
               this->m_texture_height >> (bVar9 & 0x1f),0x1908,0x1401,pvStack_20);
    iVar3 = (**(code **)(lVar6 + 0x800))();
    if (iVar3 != 0) {
      if (pvStack_20 != (void *)0x0) {
        operator_delete__(pvStack_20);
      }
      pvStack_20 = (void *)0x0;
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glTexSubImage2D() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x2753);
    }
    mipmap_color._4_4_ = mipmap_color._4_4_ + 1;
  }
  if (pvStack_20 != (void *)0x0) {
    operator_delete__(pvStack_20);
  }
  return;
}

Assistant:

void TextureViewTestReferenceCounting::initTextures()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate texture IDs */
	gl.genTextures(1, &m_parent_to_id);
	gl.genTextures(1, &m_view_to_id);
	gl.genTextures(1, &m_view_view_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call(s) failed");

	/* Set up parent texture object A */
	gl.bindTexture(GL_TEXTURE_2D, m_parent_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

	gl.texStorage2D(GL_TEXTURE_2D, m_texture_n_levels, GL_RGBA8, m_texture_width, m_texture_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed");

	/* Set up view B */
	gl.textureView(m_view_to_id, GL_TEXTURE_2D, m_parent_to_id, GL_RGBA8, 0, /* minlevel */
				   m_texture_n_levels, 0,									 /* minlayer */
				   1);														 /* numlayers */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureView() call failed");

	/* Set up view C */
	gl.textureView(m_view_view_to_id, GL_TEXTURE_2D, m_view_to_id, GL_RGBA8, 0, /* minlevel */
				   m_texture_n_levels, 0,										/* minlayer */
				   1);															/* numlayers */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureView() call failed");

	/* Fill parent texture mip-maps with different static colors */
	unsigned char* texel_data = new unsigned char[m_texture_width * m_texture_height * 4 /* components */];

	for (unsigned int n_mipmap = 0; n_mipmap < m_mipmap_colors.size(); n_mipmap++)
	{
		const _norm_vec4&  mipmap_color  = m_mipmap_colors[n_mipmap];
		const unsigned int mipmap_height = m_texture_height >> n_mipmap;
		const unsigned int mipmap_width  = m_texture_width >> n_mipmap;

		for (unsigned int n_texel = 0; n_texel < mipmap_height * mipmap_width; ++n_texel)
		{
			unsigned char* texel_data_ptr = texel_data + n_texel * sizeof(mipmap_color.rgba);

			memcpy(texel_data_ptr, mipmap_color.rgba, sizeof(mipmap_color.rgba));
		} /* for (all relevant mip-map texels) */

		/* Upload new mip-map contents */
		gl.texSubImage2D(GL_TEXTURE_2D, n_mipmap, 0, /* xoffset */
						 0,							 /* yoffset */
						 m_texture_width >> n_mipmap, m_texture_height >> n_mipmap, GL_RGBA, GL_UNSIGNED_BYTE,
						 texel_data);

		if (gl.getError() != GL_NO_ERROR)
		{
			delete[] texel_data;
			texel_data = NULL;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexSubImage2D() call failed");
		}
	} /* for (all mip-maps) */

	delete[] texel_data;
	texel_data = NULL;
}